

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int AndersonAccelerate(SUNNonlinearSolver NLS,N_Vector gval,N_Vector x,N_Vector xold,int iter)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  double *pdVar10;
  long lVar11;
  undefined8 uVar12;
  int iVar13;
  int iVar14;
  undefined8 in_RSI;
  long *in_RDI;
  int in_R8D;
  realtype rVar15;
  double dVar16;
  int damping;
  N_Vector *Xvecs;
  N_Vector *Q;
  N_Vector *dg;
  N_Vector *df;
  N_Vector fold;
  N_Vector gold;
  N_Vector vtemp;
  N_Vector fv;
  realtype *gamma;
  realtype *R;
  realtype *cvals;
  realtype onembeta;
  realtype beta;
  realtype s;
  realtype c;
  realtype rtemp;
  realtype b;
  realtype a;
  int *ipt_map;
  int maa;
  int lAA;
  int j;
  int i;
  int i_pt;
  int retval;
  int nvec;
  N_Vector in_stack_fffffffffffffef8;
  N_Vector in_stack_ffffffffffffff00;
  N_Vector in_stack_ffffffffffffff08;
  realtype in_stack_ffffffffffffff10;
  double dVar17;
  int nvec_00;
  int local_44;
  int local_40;
  int local_3c;
  int local_30;
  int local_4;
  
  puVar5 = *(undefined4 **)(*in_RDI + 0x18);
  iVar14 = *(int *)(*in_RDI + 0x10);
  lVar6 = *(long *)(*in_RDI + 0x48);
  lVar7 = *(long *)(*in_RDI + 0x50);
  puVar8 = *(undefined8 **)(*in_RDI + 0x40);
  puVar9 = *(undefined8 **)(*in_RDI + 0x60);
  pdVar10 = *(double **)(*in_RDI + 0x30);
  lVar11 = *(long *)(*in_RDI + 0x38);
  uVar12 = *(undefined8 *)(*in_RDI + 0x88);
  iVar4 = *(int *)(*in_RDI + 0x20);
  dVar16 = *(double *)(*in_RDI + 0x28);
  for (local_3c = 0; local_3c < iVar14; local_3c = local_3c + 1) {
    puVar5[local_3c] = 0;
  }
  iVar13 = (in_R8D + -1) - ((in_R8D + -1) / iVar14) * iVar14;
  N_VLinearSum(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedbf27);
  if (0 < in_R8D) {
    N_VLinearSum(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedbf64);
    N_VLinearSum(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedbf94);
  }
  N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedbfae);
  N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedbfc5);
  if (in_R8D == 0) {
    N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedbfec);
    local_4 = 0;
  }
  else {
    if (in_R8D == 1) {
      rVar15 = N_VDotProd(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      if (0.0 < rVar15) {
        rVar15 = N_VDotProd(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        dVar17 = sqrt(rVar15);
      }
      else {
        dVar17 = 0.0;
      }
      *pdVar10 = dVar17;
      N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedc0c1);
      nvec_00 = (int)((ulong)dVar17 >> 0x20);
      *puVar5 = 0;
    }
    else if (iVar14 < in_R8D) {
      for (local_3c = 0; local_3c < iVar14 + -1; local_3c = local_3c + 1) {
        dVar17 = pdVar10[(local_3c + 1) * iVar14 + local_3c];
        dVar1 = pdVar10[(local_3c + 1) * iVar14 + local_3c + 1];
        if (0.0 < dVar17 * dVar17 + dVar1 * dVar1) {
          in_stack_ffffffffffffff00 = (N_Vector)sqrt(dVar17 * dVar17 + dVar1 * dVar1);
        }
        else {
          in_stack_ffffffffffffff00 = (N_Vector)0x0;
        }
        pdVar10[(local_3c + 1) * iVar14 + local_3c] = (double)in_stack_ffffffffffffff00;
        pdVar10[(local_3c + 1) * iVar14 + local_3c + 1] = 0.0;
        if (local_3c < iVar14 + -1) {
          for (local_40 = local_3c + 2; local_40 < iVar14; local_40 = local_40 + 1) {
            dVar2 = pdVar10[local_40 * iVar14 + local_3c];
            dVar3 = pdVar10[local_40 * iVar14 + local_3c + 1];
            pdVar10[local_40 * iVar14 + local_3c + 1] =
                 -(dVar1 / (double)in_stack_ffffffffffffff00) * dVar2 +
                 (dVar17 / (double)in_stack_ffffffffffffff00) * dVar3;
            pdVar10[local_40 * iVar14 + local_3c] =
                 (dVar17 / (double)in_stack_ffffffffffffff00) * dVar2 +
                 (dVar1 / (double)in_stack_ffffffffffffff00) * dVar3;
          }
        }
        N_VLinearSum(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (N_Vector)0xedc695);
        N_VLinearSum(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (N_Vector)0xedc700);
        N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedc723);
      }
      for (local_3c = 1; local_3c < iVar14; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < iVar14 + -1; local_40 = local_40 + 1) {
          pdVar10[(local_3c + -1) * iVar14 + local_40] = pdVar10[local_3c * iVar14 + local_40];
        }
      }
      N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedc80f);
      for (local_40 = 0; local_40 < iVar14 + -1; local_40 = local_40 + 1) {
        rVar15 = N_VDotProd(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        pdVar10[(iVar14 + -1) * iVar14 + local_40] = rVar15;
        N_VLinearSum(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (N_Vector)0xedc8d9);
      }
      rVar15 = N_VDotProd(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      nvec_00 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      if (0.0 < rVar15) {
        rVar15 = N_VDotProd(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        in_stack_fffffffffffffef8 = (N_Vector)sqrt(rVar15);
      }
      else {
        in_stack_fffffffffffffef8 = (N_Vector)0x0;
      }
      pdVar10[(iVar14 + -1) * iVar14 + iVar14 + -1] = (double)in_stack_fffffffffffffef8;
      N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedc9ac);
      local_40 = 0;
      local_3c = iVar13;
      while (local_3c = local_3c + 1, local_3c < iVar14) {
        puVar5[local_40] = local_3c;
        local_40 = local_40 + 1;
      }
      for (local_3c = 0; local_3c < iVar13 + 1; local_3c = local_3c + 1) {
        puVar5[local_40] = local_3c;
        local_40 = local_40 + 1;
      }
    }
    else {
      N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedc10b);
      for (local_40 = 0; local_40 < in_R8D + -1; local_40 = local_40 + 1) {
        puVar5[local_40] = local_40;
        rVar15 = N_VDotProd(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        pdVar10[(in_R8D + -1) * iVar14 + local_40] = rVar15;
        N_VLinearSum(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (N_Vector)0xedc1ef);
      }
      rVar15 = N_VDotProd(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      nvec_00 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      if (0.0 < rVar15) {
        rVar15 = N_VDotProd(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff08 = (N_Vector)sqrt(rVar15);
      }
      else {
        in_stack_ffffffffffffff08 = (N_Vector)0x0;
      }
      pdVar10[(in_R8D + -1) * iVar14 + in_R8D + -1] = (double)in_stack_ffffffffffffff08;
      if ((pdVar10[(in_R8D + -1) * iVar14 + in_R8D + -1] != 0.0) ||
         (NAN(pdVar10[(in_R8D + -1) * iVar14 + in_R8D + -1]))) {
        N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedc314);
      }
      else {
        N_VScale((realtype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(N_Vector)0xedc2c6);
      }
      puVar5[in_R8D + -1] = in_R8D + -1;
    }
    local_44 = in_R8D;
    if (iVar14 < in_R8D) {
      local_44 = iVar14;
    }
    iVar13 = N_VDotProdMulti(nvec_00,in_stack_ffffffffffffff08,(N_Vector *)in_stack_ffffffffffffff00
                             ,(realtype *)in_stack_fffffffffffffef8);
    if (iVar13 == 0) {
      *puVar8 = 0x3ff0000000000000;
      *puVar9 = in_RSI;
      local_30 = 1;
      local_40 = local_44;
      while (local_3c = local_40 + -1, -1 < local_3c) {
        for (; local_40 < local_44; local_40 = local_40 + 1) {
          *(double *)(lVar11 + (long)local_3c * 8) =
               -pdVar10[local_40 * iVar14 + local_3c] * *(double *)(lVar11 + (long)local_40 * 8) +
               *(double *)(lVar11 + (long)local_3c * 8);
        }
        dVar17 = *(double *)(lVar11 + (long)local_3c * 8);
        if ((dVar17 != 0.0) || (NAN(dVar17))) {
          *(double *)(lVar11 + (long)local_3c * 8) =
               *(double *)(lVar11 + (long)local_3c * 8) / pdVar10[local_3c * iVar14 + local_3c];
        }
        else {
          *(undefined8 *)(lVar11 + (long)local_3c * 8) = 0;
        }
        puVar8[local_30] = *(ulong *)(lVar11 + (long)local_3c * 8) ^ 0x8000000000000000;
        puVar9[local_30] = *(undefined8 *)(lVar7 + (long)(int)puVar5[local_3c] * 8);
        local_30 = local_30 + 1;
        local_40 = local_3c;
      }
      if (iVar4 != 0) {
        dVar16 = 1.0 - dVar16;
        puVar8[local_30] = -dVar16;
        puVar9[local_30] = uVar12;
        while( true ) {
          local_30 = local_30 + 1;
          local_3c = local_44 + -1;
          if (local_3c < 0) break;
          puVar8[local_30] = dVar16 * *(double *)(lVar11 + (long)local_3c * 8);
          puVar9[local_30] = *(undefined8 *)(lVar6 + (long)(int)puVar5[local_3c] * 8);
          local_44 = local_3c;
        }
      }
      iVar14 = N_VLinearCombination
                         (nvec_00,(realtype *)in_stack_ffffffffffffff08,
                          (N_Vector *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      if (iVar14 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x388;
      }
    }
    else {
      local_4 = -0x388;
    }
  }
  return local_4;
}

Assistant:

static int AndersonAccelerate(SUNNonlinearSolver NLS, N_Vector gval,
                              N_Vector x, N_Vector xold, int iter)
{
  /* local variables */
  int         nvec, retval, i_pt, i, j, lAA, maa, *ipt_map;
  realtype    a, b, rtemp, c, s, beta, onembeta, *cvals, *R, *gamma;
  N_Vector    fv, vtemp, gold, fold, *df, *dg, *Q, *Xvecs;
  booleantype damping;

  /* local shortcut variables */
  vtemp   = x;    /* use result as temporary vector */
  ipt_map = FP_CONTENT(NLS)->imap;
  maa     = FP_CONTENT(NLS)->m;
  gold    = FP_CONTENT(NLS)->gold;
  fold    = FP_CONTENT(NLS)->fold;
  df      = FP_CONTENT(NLS)->df;
  dg      = FP_CONTENT(NLS)->dg;
  Q       = FP_CONTENT(NLS)->q;
  cvals   = FP_CONTENT(NLS)->cvals;
  Xvecs   = FP_CONTENT(NLS)->Xvecs;
  R       = FP_CONTENT(NLS)->R;
  gamma   = FP_CONTENT(NLS)->gamma;
  fv      = FP_CONTENT(NLS)->delta;
  damping = FP_CONTENT(NLS)->damping;
  beta    = FP_CONTENT(NLS)->beta;

  /* reset ipt_map, i_pt */
  for (i = 0; i < maa; i++)  ipt_map[i]=0;
  i_pt = iter-1 - ((iter-1)/maa)*maa;

  /* update dg[i_pt], df[i_pt], fv, gold and fold*/
  N_VLinearSum(ONE, gval, -ONE, xold, fv);
  if (iter > 0) {
    N_VLinearSum(ONE, gval, -ONE, gold, dg[i_pt]);  /* dg_new = gval - gold */
    N_VLinearSum(ONE, fv, -ONE, fold, df[i_pt]);    /* df_new = fv - fold */
  }
  N_VScale(ONE, gval, gold);
  N_VScale(ONE, fv, fold);

  /* on first iteration, just do basic fixed-point update */
  if (iter == 0) {
    N_VScale(ONE, gval, x);
    return(SUN_NLS_SUCCESS);
  }

  /* update data structures based on current iteration index */

  if (iter == 1) {   /* second iteration */

    R[0] = SUNRsqrt( N_VDotProd(df[i_pt], df[i_pt]) );
    N_VScale(ONE/R[0], df[i_pt], Q[i_pt]);
    ipt_map[0] = 0;

  } else if (iter <= maa) {   /* another iteration before we've reached maa */

    N_VScale(ONE, df[i_pt], vtemp);
    for (j = 0; j < iter-1; j++) {
      ipt_map[j] = j;
      R[(iter-1)*maa+j] = N_VDotProd(Q[j], vtemp);
      N_VLinearSum(ONE, vtemp, -R[(iter-1)*maa+j], Q[j], vtemp);
    }
    R[(iter-1)*maa+iter-1] = SUNRsqrt( N_VDotProd(vtemp, vtemp) );
    if (R[(iter-1)*maa+iter-1] == ZERO) {
      N_VScale(ZERO, vtemp, Q[i_pt]);
    } else {
      N_VScale((ONE/R[(iter-1)*maa+iter-1]), vtemp, Q[i_pt]);
    }
    ipt_map[iter-1] = iter-1;

  } else {   /* we've filled the acceleration subspace, so start recycling */

    /* delete left-most column vector from QR factorization */
    for (i = 0; i < maa-1; i++) {
      a = R[(i+1)*maa + i];
      b = R[(i+1)*maa + i+1];
      rtemp = SUNRsqrt(a*a + b*b);
      c = a / rtemp;
      s = b / rtemp;
      R[(i+1)*maa + i] = rtemp;
      R[(i+1)*maa + i+1] = ZERO;
      if (i < maa-1) {
        for (j = i+2; j < maa; j++) {
          a = R[j*maa + i];
          b = R[j*maa + i+1];
          rtemp = c * a + s * b;
          R[j*maa + i+1] = -s*a + c*b;
          R[j*maa + i] = rtemp;
        }
      }
      N_VLinearSum(c, Q[i], s, Q[i+1], vtemp);
      N_VLinearSum(-s, Q[i], c, Q[i+1], Q[i+1]);
      N_VScale(ONE, vtemp, Q[i]);
    }

    /* ahift R to the left by one */
    for (i = 1; i < maa; i++)
      for (j = 0; j < maa-1; j++)
        R[(i-1)*maa + j] = R[i*maa + j];

    /* add the new df vector */
    N_VScale(ONE, df[i_pt], vtemp);
    for (j = 0; j < maa-1; j++) {
      R[(maa-1)*maa+j] = N_VDotProd(Q[j], vtemp);
      N_VLinearSum(ONE, vtemp, -R[(maa-1)*maa+j], Q[j], vtemp);
    }
    R[(maa-1)*maa+maa-1] = SUNRsqrt( N_VDotProd(vtemp, vtemp) );
    N_VScale((ONE/R[(maa-1)*maa+maa-1]), vtemp, Q[maa-1]);

    /* update the iteration map */
    j = 0;
    for (i = i_pt+1; i < maa; i++)
      ipt_map[j++] = i;
    for (i = 0; i < i_pt+1; i++)
      ipt_map[j++] = i;
  }

  /* solve least squares problem and update solution */
  lAA = iter;
  if (maa < iter)  lAA = maa;
  retval = N_VDotProdMulti(lAA, fv, Q, gamma);
  if (retval != 0)  return(SUN_NLS_VECTOROP_ERR);

  /* set arrays for fused vector operation */
  cvals[0] = ONE;
  Xvecs[0] = gval;
  nvec = 1;
  for (i = lAA-1; i > -1; i--) {
    for (j = i+1; j < lAA; j++)
      gamma[i] -= R[j*maa+i]*gamma[j];
    if (gamma[i] == ZERO) {
      gamma[i] = ZERO;
    } else {
      gamma[i] /= R[i*maa+i];
    }
    cvals[nvec] = -gamma[i];
    Xvecs[nvec] = dg[ipt_map[i]];
    nvec += 1;
  }

  /* if enabled, apply damping */
  if (damping) {
    onembeta = (ONE - beta);
    cvals[nvec] = -onembeta;
    Xvecs[nvec] = fv;
    nvec += 1;
    for (i = lAA - 1; i > -1; i--) {
      cvals[nvec] = onembeta * gamma[i];
      Xvecs[nvec] = df[ipt_map[i]];
      nvec += 1;
    }
  }

  /* update solution */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, x);
  if (retval != 0)  return(SUN_NLS_VECTOROP_ERR);

  return(SUN_NLS_SUCCESS);
}